

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execution.hpp
# Opt level: O0

void __thiscall diy::Master::ProcessBlock::operator()(ProcessBlock *this)

{
  int iVar1;
  undefined1 uVar2;
  bool bVar3;
  element_type *peVar4;
  int *piVar5;
  size_type sVar6;
  const_reference pvVar7;
  Annotation *pAVar8;
  void *pvVar9;
  pointer pBVar10;
  undefined8 extraout_RDX;
  undefined8 uVar11;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  long *in_RDI;
  unique_ptr<diy::Master::BaseCommand,_std::default_delete<diy::Master::BaseCommand>_> *cmd;
  iterator __end2;
  iterator __begin2;
  Commands *__range2;
  IncomingQueuesMap *current_incoming;
  bool skip;
  Guard g;
  int gid;
  int i;
  int cur;
  vector<int,_std::allocator<int>_> local;
  undefined4 in_stack_fffffffffffffe48;
  int in_stack_fffffffffffffe4c;
  Master *in_stack_fffffffffffffe50;
  mapped_type *in_stack_fffffffffffffe58;
  Master *in_stack_fffffffffffffe60;
  Master *in_stack_fffffffffffffe68;
  Master *in_stack_fffffffffffffe70;
  mapped_type *in_stack_fffffffffffffe88;
  undefined7 in_stack_fffffffffffffe90;
  undefined1 local_130 [56];
  IExchangeInfo *in_stack_ffffffffffffff08;
  int in_stack_ffffffffffffff14;
  Master *in_stack_ffffffffffffff18;
  __normal_iterator<std::unique_ptr<diy::Master::BaseCommand,_std::default_delete<diy::Master::BaseCommand>_>_*,_std::vector<std::unique_ptr<diy::Master::BaseCommand,_std::default_delete<diy::Master::BaseCommand>_>,_std::allocator<std::unique_ptr<diy::Master::BaseCommand,_std::default_delete<diy::Master::BaseCommand>_>_>_>_>
  local_80;
  long local_78;
  mapped_type *local_70;
  byte local_63;
  Annotation local_62;
  Guard local_61;
  int local_60;
  value_type local_5c;
  undefined4 local_58;
  resource_accessor<int,_tthread::fast_mutex> local_48;
  int local_2c;
  vector<int,_std::allocator<int>_> local_28;
  id local_10 [2];
  
  peVar4 = std::__shared_ptr_access<diy::spd::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<diy::spd::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x12890b);
  local_10[0] = std::this_thread::get_id();
  spd::logger::debug<std::thread::id>(peVar4,"Processing with thread: {}",local_10);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x128949);
  uVar11 = extraout_RDX;
  while( true ) {
    critical_resource<int,_tthread::fast_mutex>::access
              ((critical_resource<int,_tthread::fast_mutex> *)&local_48,(char *)in_RDI[3],
               (int)uVar11);
    piVar5 = resource_accessor<int,_tthread::fast_mutex>::operator*(&local_48);
    iVar1 = *piVar5;
    *piVar5 = iVar1 + 1;
    resource_accessor<int,_tthread::fast_mutex>::~resource_accessor
              ((resource_accessor<int,_tthread::fast_mutex> *)0x128992);
    local_2c = iVar1;
    sVar6 = std::deque<int,_std::allocator<int>_>::size
                      ((deque<int,_std::allocator<int>_> *)0x1289b8);
    if (sVar6 <= (ulong)(long)iVar1) break;
    pvVar7 = std::deque<int,_std::allocator<int>_>::operator[]
                       ((deque<int,_std::allocator<int>_> *)in_stack_fffffffffffffe50,
                        CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
    local_5c = *pvVar7;
    local_60 = Master::gid(in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c);
    stats::Annotation::Annotation(&local_62,"diy.block");
    pAVar8 = stats::Annotation::set<int>(&local_62,local_60);
    stats::Annotation::Guard::Guard(&local_61,pAVar8);
    pvVar9 = block(in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c);
    if (pvVar9 != (void *)0x0) {
      sVar6 = std::vector<int,_std::allocator<int>_>::size(&local_28);
      if (sVar6 == (long)(int)in_RDI[2]) {
        unload(in_stack_fffffffffffffe60,
               (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe58);
      }
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe60,
                 (value_type_conflict *)in_stack_fffffffffffffe58);
    }
    peVar4 = std::__shared_ptr_access<diy::spd::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<diy::spd::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x128b1d);
    spd::logger::debug<int>(peVar4,"Processing block: {}",&local_60);
    uVar2 = all_skip((ProcessBlock *)in_stack_fffffffffffffe70,
                     (int)((ulong)in_stack_fffffffffffffe68 >> 0x20));
    local_63 = uVar2;
    in_stack_fffffffffffffe88 =
         std::
         map<int,_diy::Master::IncomingRound,_std::less<int>,_std::allocator<std::pair<const_int,_diy::Master::IncomingRound>_>_>
         ::operator[]((map<int,_diy::Master::IncomingRound,_std::less<int>,_std::allocator<std::pair<const_int,_diy::Master::IncomingRound>_>_>
                       *)CONCAT17(uVar2,in_stack_fffffffffffffe90),
                      (key_type *)in_stack_fffffffffffffe88);
    local_70 = in_stack_fffffffffffffe88;
    pvVar9 = block(in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c);
    if (pvVar9 == (void *)0x0) {
      if ((local_63 & 1) == 0) {
        sVar6 = std::vector<int,_std::allocator<int>_>::size(&local_28);
        if (sVar6 == (long)(int)in_RDI[2]) {
          unload(in_stack_fffffffffffffe60,
                 (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe58);
        }
        Master::load(in_stack_fffffffffffffe60,(int)((ulong)in_stack_fffffffffffffe58 >> 0x20));
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe60,
                   (value_type_conflict *)in_stack_fffffffffffffe58);
      }
      else {
        load_queues(in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c);
      }
    }
    local_78 = *in_RDI + 0x200;
    local_80._M_current =
         (unique_ptr<diy::Master::BaseCommand,_std::default_delete<diy::Master::BaseCommand>_> *)
         std::
         vector<std::unique_ptr<diy::Master::BaseCommand,_std::default_delete<diy::Master::BaseCommand>_>,_std::allocator<std::unique_ptr<diy::Master::BaseCommand,_std::default_delete<diy::Master::BaseCommand>_>_>_>
         ::begin((vector<std::unique_ptr<diy::Master::BaseCommand,_std::default_delete<diy::Master::BaseCommand>_>,_std::allocator<std::unique_ptr<diy::Master::BaseCommand,_std::default_delete<diy::Master::BaseCommand>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
    std::
    vector<std::unique_ptr<diy::Master::BaseCommand,_std::default_delete<diy::Master::BaseCommand>_>,_std::allocator<std::unique_ptr<diy::Master::BaseCommand,_std::default_delete<diy::Master::BaseCommand>_>_>_>
    ::end((vector<std::unique_ptr<diy::Master::BaseCommand,_std::default_delete<diy::Master::BaseCommand>_>,_std::allocator<std::unique_ptr<diy::Master::BaseCommand,_std::default_delete<diy::Master::BaseCommand>_>_>_>
           *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
    while (bVar3 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::unique_ptr<diy::Master::BaseCommand,_std::default_delete<diy::Master::BaseCommand>_>_*,_std::vector<std::unique_ptr<diy::Master::BaseCommand,_std::default_delete<diy::Master::BaseCommand>_>,_std::allocator<std::unique_ptr<diy::Master::BaseCommand,_std::default_delete<diy::Master::BaseCommand>_>_>_>_>
                               *)in_stack_fffffffffffffe50,
                              (__normal_iterator<std::unique_ptr<diy::Master::BaseCommand,_std::default_delete<diy::Master::BaseCommand>_>_*,_std::vector<std::unique_ptr<diy::Master::BaseCommand,_std::default_delete<diy::Master::BaseCommand>_>,_std::allocator<std::unique_ptr<diy::Master::BaseCommand,_std::default_delete<diy::Master::BaseCommand>_>_>_>_>
                               *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48)),
          bVar3) {
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<diy::Master::BaseCommand,_std::default_delete<diy::Master::BaseCommand>_>_*,_std::vector<std::unique_ptr<diy::Master::BaseCommand,_std::default_delete<diy::Master::BaseCommand>_>,_std::allocator<std::unique_ptr<diy::Master::BaseCommand,_std::default_delete<diy::Master::BaseCommand>_>_>_>_>
      ::operator*(&local_80);
      pBVar10 = std::
                unique_ptr<diy::Master::BaseCommand,_std::default_delete<diy::Master::BaseCommand>_>
                ::operator->((unique_ptr<diy::Master::BaseCommand,_std::default_delete<diy::Master::BaseCommand>_>
                              *)0x128cbe);
      if ((local_63 & 1) == 0) {
        in_stack_fffffffffffffe68 =
             (Master *)block(in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c);
        in_stack_fffffffffffffe60 = in_stack_fffffffffffffe68;
      }
      else {
        in_stack_fffffffffffffe60 = (Master *)0x0;
      }
      in_stack_fffffffffffffe70 = in_stack_fffffffffffffe60;
      proxy(in_stack_ffffffffffffff18,in_stack_ffffffffffffff14,in_stack_ffffffffffffff08);
      (*pBVar10->_vptr_BaseCommand[2])(pBVar10,in_stack_fffffffffffffe60,local_130);
      ProxyWithLink::~ProxyWithLink((ProxyWithLink *)0x128d53);
      in_stack_fffffffffffffe58 =
           std::
           map<int,_diy::concurrent_map<int,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>,_std::less<int>,_std::allocator<std::pair<const_int,_diy::concurrent_map<int,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>_>_>_>
           ::operator[]((map<int,_diy::concurrent_map<int,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>,_std::less<int>,_std::allocator<std::pair<const_int,_diy::concurrent_map<int,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>_>_>_>
                         *)CONCAT17(uVar2,in_stack_fffffffffffffe90),
                        (key_type *)in_stack_fffffffffffffe88);
      concurrent_map<int,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>
      ::clear((concurrent_map<int,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>
               *)in_stack_fffffffffffffe60);
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<diy::Master::BaseCommand,_std::default_delete<diy::Master::BaseCommand>_>_*,_std::vector<std::unique_ptr<diy::Master::BaseCommand,_std::default_delete<diy::Master::BaseCommand>_>,_std::allocator<std::unique_ptr<diy::Master::BaseCommand,_std::default_delete<diy::Master::BaseCommand>_>_>_>_>
      ::operator++(&local_80);
    }
    uVar11 = extraout_RDX_00;
    if (((local_63 & 1) != 0) &&
       (in_stack_fffffffffffffe50 =
             (Master *)block(in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c),
       uVar11 = extraout_RDX_01, in_stack_fffffffffffffe50 == (Master *)0x0)) {
      unload_queues((Master *)0x0,in_stack_fffffffffffffe4c);
      uVar11 = extraout_RDX_02;
    }
  }
  local_58 = 1;
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe60);
  return;
}

Assistant:

void    operator()()
  {
    master.log->debug("Processing with thread: {}",  this_thread::get_id());

    std::vector<int>      local;
    do
    {
      int cur = (*idx.access())++;

      if ((size_t)cur >= blocks.size())
          return;

      int i   = blocks[cur];
      int gid = master.gid(i);
      stats::Annotation::Guard g( stats::Annotation("diy.block").set(gid) );

      if (master.block(i))
      {
          if (local.size() == (size_t)local_limit)
              master.unload(local);
          local.push_back(i);
      }

      master.log->debug("Processing block: {}", gid);

      bool skip = all_skip(i);

      IncomingQueuesMap &current_incoming = master.incoming_[master.exchange_round_].map;

      if (master.block(i) == 0)             // block unloaded
      {
          if (skip)
              master.load_queues(i);        // even though we are skipping the block, the queues might be necessary
          else
          {
              if (local.size() == (size_t)local_limit)      // reached the local limit
                  master.unload(local);

              master.load(i);
              local.push_back(i);
          }
      }

      for (auto& cmd : master.commands_)
      {
          cmd->execute(skip ? 0 : master.block(i), master.proxy(i));

          // no longer need them, so get rid of them
          current_incoming[gid].clear();
      }

      if (skip && master.block(i) == 0)
          master.unload_queues(i);    // even though we are skipping the block, the queues might be necessary
    } while(true);
  }